

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deepTiledExamples.cpp
# Opt level: O2

void readDeepTiledFile(char *filename,Box2i *displayWindow,Box2i *dataWindow,Array2D<float_*> *dataZ
                      ,Array2D<Imath_3_2::half_*> *dataA,Array2D<unsigned_int> *sampleCount)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  int j;
  long lVar5;
  long lVar6;
  long lVar7;
  int i;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  DeepTiledInputFile file;
  Slice local_d0 [56];
  DeepFrameBuffer frameBuffer;
  
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::DeepTiledInputFile::DeepTiledInputFile(&file,filename,iVar1);
  lVar9 = (long)(dataWindow->max).x - (long)(dataWindow->min).x;
  lVar4 = lVar9 + 1;
  lVar11 = (long)(dataWindow->max).y - (long)(dataWindow->min).y;
  lVar6 = lVar11 + 1;
  Imf_3_4::Array2D<unsigned_int>::resizeErase(sampleCount,lVar6,lVar4);
  Imf_3_4::Array2D<float_*>::resizeErase(dataZ,lVar6,lVar4);
  Imf_3_4::Array2D<Imath_3_2::half_*>::resizeErase(dataA,lVar6,lVar4);
  Imf_3_4::DeepFrameBuffer::DeepFrameBuffer(&frameBuffer);
  lVar6 = (long)(int)lVar4;
  Imf_3_4::Slice::Slice
            (local_d0,UINT,
             (char *)(sampleCount->_data +
                     (-(long)(dataWindow->min).x - (dataWindow->min).y * lVar6)),4,lVar4 * 4,1,1,0.0
             ,false,false);
  Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  Imf_3_4::DeepSlice::DeepSlice
            ((DeepSlice *)local_d0,FLOAT,
             (char *)(dataZ->_data + (-(long)(dataWindow->min).x - (dataWindow->min).y * lVar6)),8,
             lVar4 * 8,4,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insert((char *)&frameBuffer,(DeepSlice *)0x112763);
  Imf_3_4::DeepSlice::DeepSlice
            ((DeepSlice *)local_d0,HALF,
             (char *)(dataA->_data + (-(long)(dataWindow->min).x - (dataWindow->min).y * lVar6)),8,
             lVar4 * 8,2,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insert((char *)&frameBuffer,(DeepSlice *)0x112769);
  Imf_3_4::DeepTiledInputFile::setFrameBuffer((DeepFrameBuffer *)&file);
  iVar1 = Imf_3_4::DeepTiledInputFile::numXTiles((int)&file);
  iVar2 = Imf_3_4::DeepTiledInputFile::numYTiles((int)&file);
  Imf_3_4::DeepTiledInputFile::readPixelSampleCounts((int)&file,0,iVar1 + -1,0,iVar2 + -1);
  lVar10 = (long)(int)lVar9;
  lVar11 = (long)(int)lVar11;
  lVar6 = 0;
  lVar9 = 0;
  for (lVar4 = 0; lVar4 <= lVar11; lVar4 = lVar4 + 1) {
    lVar8 = dataA->_sizeY * lVar9;
    lVar7 = sampleCount->_sizeY * lVar6;
    lVar12 = dataZ->_sizeY * lVar9;
    for (lVar5 = 0; lVar5 <= lVar10; lVar5 = lVar5 + 1) {
      pvVar3 = operator_new__((ulong)*(uint *)((long)sampleCount->_data + lVar7) << 2);
      *(void **)((long)dataZ->_data + lVar12) = pvVar3;
      pvVar3 = operator_new__((ulong)*(uint *)((long)sampleCount->_data + lVar7) * 2);
      *(void **)((long)dataA->_data + lVar8) = pvVar3;
      lVar8 = lVar8 + 8;
      lVar7 = lVar7 + 4;
      lVar12 = lVar12 + 8;
    }
    lVar9 = lVar9 + 8;
    lVar6 = lVar6 + 4;
  }
  Imf_3_4::DeepTiledInputFile::readTiles((int)&file,0,iVar1 + -1,0,iVar2 + -1);
  lVar6 = 0;
  for (lVar4 = 0; lVar4 <= lVar11; lVar4 = lVar4 + 1) {
    for (lVar9 = 0; lVar9 <= lVar10; lVar9 = lVar9 + 1) {
      pvVar3 = *(void **)((long)dataZ->_data + lVar9 * 8 + dataZ->_sizeY * lVar6);
      if (pvVar3 != (void *)0x0) {
        operator_delete__(pvVar3);
      }
      pvVar3 = *(void **)((long)dataA->_data + lVar9 * 8 + dataA->_sizeY * lVar6);
      if (pvVar3 != (void *)0x0) {
        operator_delete__(pvVar3);
      }
    }
    lVar6 = lVar6 + 8;
  }
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
               *)&frameBuffer);
  Imf_3_4::DeepTiledInputFile::~DeepTiledInputFile(&file);
  return;
}

Assistant:

void
readDeepTiledFile (
    const char             filename[],
    Box2i&                 displayWindow,
    Box2i&                 dataWindow,
    Array2D<float*>&       dataZ,
    Array2D<half*>&        dataA,
    Array2D<unsigned int>& sampleCount)
{
    //
    // Read a deep image using class DeepTiledInputFile.  Try to read one
    // channel, A, of type HALF, and one channel, Z,
    // of type FLOAT.  Store the A, and Z pixels in two
    // separate memory buffers.
    //
    //    - open the file
    //    - allocate memory for the pixels
    //    - describe the layout of the A, and Z pixel buffers
    //    - read the sample counts from the file
    //    - allocate the memory required to store the samples
    //    - read the pixels from the file
    //

    DeepTiledInputFile file (filename);

    int width  = dataWindow.max.x - dataWindow.min.x + 1;
    int height = dataWindow.max.y - dataWindow.min.y + 1;

    sampleCount.resizeErase (height, width);
    dataZ.resizeErase (height, width);
    dataA.resizeErase (height, width);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (
        UINT,
        (char*) (&sampleCount[0][0] - dataWindow.min.x -
                 dataWindow.min.y * width),
        sizeof (unsigned int) * 1,       // xStride
        sizeof (unsigned int) * width)); // yStride

    frameBuffer.insert (
        "Z",
        DeepSlice (
            FLOAT,
            (char*) (&dataZ[0][0] - dataWindow.min.x -
                     dataWindow.min.y * width),
            sizeof (float*) * 1,     // xStride for pointer array
            sizeof (float*) * width, // yStride for pointer array
            sizeof (float) * 1));    // stride for samples

    frameBuffer.insert (
        "A",
        DeepSlice (
            HALF,
            (char*) (&dataA[0][0] - dataWindow.min.x -
                     dataWindow.min.y * width),
            sizeof (half*) * 1,     // xStride for pointer array
            sizeof (half*) * width, // yStride for pointer array
            sizeof (half) * 1));    // stride for samples

    file.setFrameBuffer (frameBuffer);

    int numXTiles = file.numXTiles (0);
    int numYTiles = file.numYTiles (0);

    file.readPixelSampleCounts (0, numXTiles - 1, 0, numYTiles - 1);

    for (int i = 0; i < height; i++)
    {
        for (int j = 0; j < width; j++)
        {
            dataZ[i][j] = new float[sampleCount[i][j]];
            dataA[i][j] = new half[sampleCount[i][j]];
        }
    }

    file.readTiles (0, numXTiles - 1, 0, numYTiles - 1);

    // (after read data is processed, data must be freed:)

    for (int i = 0; i < height; i++)
    {
        for (int j = 0; j < width; j++)
        {
            delete[] dataZ[i][j];
            delete[] dataA[i][j];
        }
    }
}